

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> *
deqp::gles2::Performance::vectorLowestPercentage<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *v,float factor)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  pointer plVar4;
  pointer plVar5;
  float fVar6;
  
  fVar6 = ceilf((float)(ulong)((long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                     super__Vector_impl_data._M_start >> 3) * factor);
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__,v);
  plVar5 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar4 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar5 != plVar4) {
    uVar3 = (long)plVar4 - (long)plVar5 >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar5,plVar4,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar5,plVar4);
    plVar5 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar4 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar2 = (uint)fVar6;
  uVar3 = (long)plVar4 - (long)plVar5;
  if ((int)uVar2 < (int)(uVar3 >> 3)) {
    do {
      uVar3 = uVar3 - 8;
      plVar4 = plVar4 + -1;
    } while ((int)uVar2 < (int)(uVar3 >> 3));
    (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
    super__Vector_impl_data._M_finish = plVar4;
  }
  return (vector<long,_std::allocator<long>_> *)(ulong)uVar2;
}

Assistant:

static vector<T> vectorLowestPercentage (const vector<T>& v, float factor)
{
	DE_ASSERT(0.0f < factor && factor <= 1.0f);

	int			targetSize	= (int)(deFloatCeil(factor*(float)v.size()));
	vector<T>	temp		= v;
	std::sort(temp.begin(), temp.end());

	while ((int)temp.size() > targetSize)
		temp.pop_back();

	return temp;
}